

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O0

int cset_read_support_filter_program(creation_set *cset,archive *a)

{
  archive *in_RSI;
  long in_RDI;
  int i;
  int cnt;
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x10); iVar1 = iVar1 + 1) {
    if (*(int *)(*(long *)(in_RDI + 8) + (long)iVar1 * 0x10) != 0) {
      archive_read_support_filter_program(in_RSI,(char *)CONCAT44(iVar2,iVar1));
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

int
cset_read_support_filter_program(struct creation_set *cset, struct archive *a)
{
	int cnt = 0, i;

	for (i = 0; i < cset->filter_count; i++) {
		if (cset->filters[i].program) {
			archive_read_support_filter_program(a,
			    cset->filters[i].filter_name);
			++cnt;
		}
	}
	return (cnt);
}